

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O0

size_t find_histogram_index(double energy)

{
  size_t sVar1;
  ulong uVar2;
  size_t index_mid;
  size_t index_max;
  size_t index_min;
  double energy_local;
  
  index_max = 0;
  index_mid = 1000;
  do {
    uVar2 = index_max + index_mid >> 1;
    sVar1 = uVar2;
    if (histogram_energy_boundaries[uVar2] <= energy) {
      sVar1 = index_mid;
      index_max = uVar2;
    }
    index_mid = sVar1;
  } while (index_mid - index_max != 1);
  return index_max;
}

Assistant:

static size_t find_histogram_index(double energy) {
  size_t index_min = 0;
  size_t index_max = 1000;
  size_t index_mid;

  do {
    index_mid = (index_min + index_max) / 2;
    if (energy >= histogram_energy_boundaries[index_mid]) {
      index_min = index_mid;
    } else {
      index_max = index_mid;
    }
  } while (index_max - index_min != 1);

  return index_min;
}